

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Geometry2D.cpp
# Opt level: O0

void __thiscall Assimp::X3DImporter::ParseNode_Geometry2D_TriangleSet2D(X3DImporter *this)

{
  float _x;
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  pointer pFVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar6;
  size_type sVar7;
  DeadlyImportError *this_00;
  CX3DImporter_NodeElement_Geometry2D *pCVar8;
  list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *this_01;
  pointer paVar9;
  allocator<char> local_121;
  string local_120;
  aiVector3t<float> local_fc;
  _Self local_f0;
  _Self local_e8;
  iterator it2;
  string local_d8;
  undefined4 local_b8;
  allocator<char> local_b1;
  undefined1 local_b0 [8];
  string an;
  uint local_7c;
  int idx_end;
  int idx;
  CX3DImporter_NodeElement *ne;
  list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> vertices;
  undefined1 local_50 [7];
  bool solid;
  string use;
  string def;
  X3DImporter *this_local;
  
  std::__cxx11::string::string((string *)(use.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_50);
  vertices.super__List_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl._M_node.
  _M_size._7_1_ = 0;
  std::__cxx11::list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::list
            ((list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)&ne);
  _idx_end = (CX3DImporter_NodeElement_Geometry2D *)0x0;
  local_7c = 0;
  pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                     (&this->mReader);
  iVar2 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  for (; (int)local_7c < iVar2; local_7c = local_7c + 1) {
    pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    iVar3 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                      (pFVar5,(ulong)local_7c);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_b0,(char *)CONCAT44(extraout_var,iVar3),&local_b1);
    std::allocator<char>::~allocator(&local_b1);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_b0,"DEF");
    if (bVar1) {
      pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                         (&this->mReader);
      iVar3 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                        (pFVar5,(ulong)local_7c);
      std::__cxx11::string::operator=
                ((string *)(use.field_2._M_local_buf + 8),(char *)CONCAT44(extraout_var_00,iVar3));
      local_b8 = 4;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_b0,"USE");
      if (bVar1) {
        pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::
                 operator->(&this->mReader);
        iVar3 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                          (pFVar5,(ulong)local_7c);
        std::__cxx11::string::operator=((string *)local_50,(char *)CONCAT44(extraout_var_01,iVar3));
        local_b8 = 4;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_b0,"bboxCenter");
        if (bVar1) {
          local_b8 = 4;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_b0,"bboxSize");
          if (bVar1) {
            local_b8 = 4;
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_b0,"containerField");
            if (bVar1) {
              local_b8 = 4;
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_b0,"vertices");
              if (bVar1) {
                XML_ReadNode_GetAttrVal_AsListVec2f
                          (this,local_7c,
                           (list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)&ne);
                local_b8 = 4;
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_b0,"solid");
                if (bVar1) {
                  vertices.super__List_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                  _M_impl._M_node._M_size._7_1_ = XML_ReadNode_GetAttrVal_AsBool(this,local_7c);
                  local_b8 = 4;
                }
                else {
                  Throw_IncorrectAttr(this,(string *)local_b0);
                  local_b8 = 0;
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)local_b0);
  }
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    XML_CheckNode_MustBeEmpty(this);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      Throw_DEF_And_USE(this);
    }
    bVar1 = FindNodeElement(this,(string *)local_50,ENET_TriangleSet2D,
                            (CX3DImporter_NodeElement **)&idx_end);
    if (!bVar1) {
      Throw_USE_NotFound(this,(string *)local_50);
    }
    std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
    push_back(&this->NodeElement_Cur->Child,(value_type *)&idx_end);
  }
  else {
    sVar7 = std::__cxx11::list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::size
                      ((list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)&ne);
    if (sVar7 % 3 != 0) {
      it2._M_node._6_1_ = 1;
      this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d8,"TriangleSet2D. Not enough points for defining triangle.",
                 (allocator<char> *)((long)&it2._M_node + 7));
      DeadlyImportError::DeadlyImportError(this_00,&local_d8);
      it2._M_node._6_1_ = 0;
      __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    pCVar8 = (CX3DImporter_NodeElement_Geometry2D *)operator_new(0x78);
    CX3DImporter_NodeElement_Geometry2D::CX3DImporter_NodeElement_Geometry2D
              (pCVar8,ENET_TriangleSet2D,this->NodeElement_Cur);
    _idx_end = pCVar8;
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      std::__cxx11::string::operator=
                ((string *)&(_idx_end->super_CX3DImporter_NodeElement).ID,
                 (string *)(use.field_2._M_local_buf + 8));
    }
    local_e8._M_node =
         (_List_node_base *)
         std::__cxx11::list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::begin
                   ((list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)&ne);
    while( true ) {
      local_f0._M_node =
           (_List_node_base *)
           std::__cxx11::list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::end
                     ((list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)&ne);
      bVar1 = std::operator!=(&local_e8,&local_f0);
      if (!bVar1) break;
      this_01 = &_idx_end->Vertices;
      paVar9 = std::_List_iterator<aiVector2t<float>_>::operator->(&local_e8);
      _x = paVar9->x;
      paVar9 = std::_List_iterator<aiVector2t<float>_>::operator->(&local_e8);
      aiVector3t<float>::aiVector3t(&local_fc,_x,paVar9->y,0.0);
      std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                (this_01,&local_fc);
      std::_List_iterator<aiVector2t<float>_>::operator++(&local_e8);
    }
    _idx_end->Solid =
         (bool)(vertices.super__List_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                _M_impl._M_node._M_size._7_1_ & 1);
    _idx_end->NumIndices = 3;
    pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    uVar4 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    pCVar8 = _idx_end;
    if ((uVar4 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_120,"TriangleSet2D",&local_121);
      ParseNode_Metadata(this,&pCVar8->super_CX3DImporter_NodeElement,&local_120);
      std::__cxx11::string::~string((string *)&local_120);
      std::allocator<char>::~allocator(&local_121);
    }
    else {
      std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
      push_back(&this->NodeElement_Cur->Child,(value_type *)&idx_end);
    }
    std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
    push_back(&this->NodeElement_List,(value_type *)&idx_end);
  }
  std::__cxx11::list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::~list
            ((list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)&ne);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)(use.field_2._M_local_buf + 8));
  return;
}

Assistant:

void X3DImporter::ParseNode_Geometry2D_TriangleSet2D()
{
    std::string def, use;
    bool solid = false;
    std::list<aiVector2D> vertices;
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_REF("vertices", vertices, XML_ReadNode_GetAttrVal_AsListVec2f);
		MACRO_ATTRREAD_CHECK_RET("solid", solid, XML_ReadNode_GetAttrVal_AsBool);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_TriangleSet2D, ne);
	}
	else
	{
		if(vertices.size() % 3) throw DeadlyImportError("TriangleSet2D. Not enough points for defining triangle.");

		// create and if needed - define new geometry object.
		ne = new CX3DImporter_NodeElement_Geometry2D(CX3DImporter_NodeElement::ENET_TriangleSet2D, NodeElement_Cur);
		if(!def.empty()) ne->ID = def;

		// convert vec2 to vec3
		for(std::list<aiVector2D>::iterator it2 = vertices.begin(); it2 != vertices.end(); ++it2)
		{
			((CX3DImporter_NodeElement_Geometry2D*)ne)->Vertices.push_back(aiVector3D(it2->x, it2->y, 0));
		}

		((CX3DImporter_NodeElement_Geometry2D*)ne)->Solid = solid;
		((CX3DImporter_NodeElement_Geometry2D*)ne)->NumIndices = 3;
		// check for X3DMetadataObject childs.
		if(!mReader->isEmptyElement())
			ParseNode_Metadata(ne, "TriangleSet2D");
		else
			NodeElement_Cur->Child.push_back(ne);// add made object as child to current element

		NodeElement_List.push_back(ne);// add element to node element list because its a new object in graph
	}// if(!use.empty()) else
}